

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::MatchTrimEnds(ON_Brep *this,ON_BrepLoop *Loop)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ON_BrepTrim *pOVar4;
  ON_BrepTrim *T1;
  ON_BrepTrim *trim;
  bool local_1d;
  int count;
  bool rc;
  int i;
  ON_BrepLoop *Loop_local;
  ON_Brep *this_local;
  
  local_1d = true;
  iVar2 = ON_SimpleArray<int>::Count(&Loop->m_ti);
  for (count = 0; count < iVar2; count = count + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](&Loop->m_ti,count);
    pOVar4 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar3);
    piVar3 = ON_SimpleArray<int>::operator[](&Loop->m_ti,(count + 1) % iVar2);
    T1 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar3);
    bVar1 = MatchTrimEnds(this,pOVar4,T1);
    if (!bVar1) {
      local_1d = false;
    }
  }
  ON_BoundingBox::Destroy(&Loop->m_pbox);
  for (count = 0; count < iVar2; count = count + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](&Loop->m_ti,count);
    pOVar4 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar3);
    (pOVar4->m_pbox).m_min.z = 0.0;
    (pOVar4->m_pbox).m_max.z = 0.0;
    ON_BoundingBox::Union(&Loop->m_pbox,&pOVar4->m_pbox);
  }
  return local_1d;
}

Assistant:

bool ON_Brep::MatchTrimEnds(ON_BrepLoop& Loop)

{
  int i;
  bool rc = true;
  int count = Loop.m_ti.Count();
  for (i=0; i<count; i++){
    if (!MatchTrimEnds(m_T[Loop.m_ti[i]], m_T[Loop.m_ti[(i+1)%count]]))
    {
      rc = false;
    }
  }

  // 11 Nov 2002 Dale Lear: I added this pbox setting stuff
  Loop.m_pbox.Destroy();
  for (i=0; i<count; i++)
  {
    ON_BrepTrim& trim = m_T[Loop.m_ti[i]];
    trim.m_pbox.m_min.z = 0.0;
    trim.m_pbox.m_max.z = 0.0;
    Loop.m_pbox.Union( trim.m_pbox );
  }

  return rc;
}